

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  LogMessage *other;
  ParseContext ctx;
  ZeroCopyCodedInputStream zcis;
  LogFinisher local_e9;
  EpsCopyInputStream local_e8;
  int local_90;
  undefined4 local_8c;
  DescriptorPool *local_88;
  MessageFactory *pMStack_80;
  ZeroCopyInputStream local_78;
  CodedInputStream *local_70;
  LogMessage local_68;
  
  local_78._vptr_ZeroCopyInputStream = (_func_int **)&PTR__ZeroCopyInputStream_00211dc0;
  local_90 = input->recursion_budget_;
  local_e8.aliasing_ = (uintptr_t)input->aliasing_enabled_;
  local_e8.buffer_[8] = '\0';
  local_e8.buffer_[9] = '\0';
  local_e8.buffer_[10] = '\0';
  local_e8.buffer_[0xb] = '\0';
  local_e8.buffer_[0xc] = '\0';
  local_e8.buffer_[0xd] = '\0';
  local_e8.buffer_[0xe] = '\0';
  local_e8.buffer_[0xf] = '\0';
  local_e8.buffer_[0x10] = '\0';
  local_e8.buffer_[0x11] = '\0';
  local_e8.buffer_[0x12] = '\0';
  local_e8.buffer_[0x13] = '\0';
  local_e8.buffer_[0x14] = '\0';
  local_e8.buffer_[0x15] = '\0';
  local_e8.buffer_[0x16] = '\0';
  local_e8.buffer_[0x17] = '\0';
  local_e8.zcis_ = (ZeroCopyInputStream *)0x0;
  local_e8.buffer_[0] = '\0';
  local_e8.buffer_[1] = '\0';
  local_e8.buffer_[2] = '\0';
  local_e8.buffer_[3] = '\0';
  local_e8.buffer_[4] = '\0';
  local_e8.buffer_[5] = '\0';
  local_e8.buffer_[6] = '\0';
  local_e8.buffer_[7] = '\0';
  local_e8.buffer_[0x18] = '\0';
  local_e8.buffer_[0x19] = '\0';
  local_e8.buffer_[0x1a] = '\0';
  local_e8.buffer_[0x1b] = '\0';
  local_e8.buffer_[0x1c] = '\0';
  local_e8.buffer_[0x1d] = '\0';
  local_e8.buffer_[0x1e] = '\0';
  local_e8.buffer_[0x1f] = '\0';
  local_e8.last_tag_minus_1_ = 0;
  local_e8.overall_limit_ = 0x7fffffff;
  local_8c = 0x80000000;
  local_88 = (DescriptorPool *)0x0;
  pMStack_80 = (MessageFactory *)0x0;
  local_70 = input;
  pcVar3 = internal::EpsCopyInputStream::InitFrom(&local_e8,&local_78);
  local_8c = 0;
  local_88 = input->extension_pool_;
  pMStack_80 = input->extension_factory_;
  iVar2 = (*this->_vptr_MessageLite[0xb])(this,pcVar3,&local_e8);
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  if (pcVar3 == (char *)0x0) {
LAB_0019469e:
    cVar1 = '\0';
  }
  else {
    internal::EpsCopyInputStream::BackUp(&local_e8,pcVar3);
    if (local_e8.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
    }
    else {
      if (local_e8.last_tag_minus_1_ == 0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/message_lite.cc",0xf0);
        other = internal::LogMessage::operator<<(&local_68,"CHECK failed: ctx.LastTag() != 1: ");
        internal::LogFinisher::operator=(&local_e9,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
      if ((local_e8.limit_end_ < pcVar3) &&
         ((local_e8.next_chunk_ == (char *)0x0 ||
          ((long)local_e8.limit_ < (long)pcVar3 - (long)local_e8.buffer_end_)))) goto LAB_0019469e;
      input->last_tag_ = local_e8.last_tag_minus_1_ + 1;
    }
    if ((parse_flags & kMergePartial) == kMerge) {
      iVar2 = (*this->_vptr_MessageLite[6])(this);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') {
        LogInitializationErrorMessage(this);
      }
    }
    else {
      cVar1 = '\x01';
    }
  }
  return (bool)cVar1;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = _InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    GOOGLE_DCHECK(ctx.LastTag() != 1);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}